

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

int __thiscall
baryonyx::itm::compute_order::
push_and_run<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array,float>
          (compute_order *this,
          solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
          *solver,bit_array *x,random_engine *rng,float kappa,float delta,float theta,
          float objective_amplifier)

{
  random_engine *prVar1;
  bit_array *pbVar2;
  constraint_order cVar3;
  iterator iVar4;
  iterator iVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  iterator iVar8;
  iterator iVar9;
  const_iterator cVar10;
  const_iterator cVar11;
  undefined1 local_58 [16];
  undefined4 local_48;
  byte local_41;
  int remaining;
  float fStack_3c;
  bool pi_changed;
  float objective_amplifier_local;
  float theta_local;
  float delta_local;
  float kappa_local;
  random_engine *rng_local;
  bit_array *x_local;
  solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
  *solver_local;
  compute_order *this_local;
  
  local_41 = 0;
  local_48 = 0;
  remaining = (int)objective_amplifier;
  fStack_3c = theta;
  objective_amplifier_local = delta;
  theta_local = kappa;
  _delta_local = rng;
  rng_local = (random_engine *)x;
  x_local = (bit_array *)solver;
  solver_local = (solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                  *)this;
  if ((this->use_cycle & 1U) != 0) {
    cVar3 = next_state(this->order);
    this->order = cVar3;
  }
  pbVar2 = x_local;
  prVar1 = rng_local;
  switch(this->order) {
  case none:
  default:
    cVar10 = std::vector<int,_std::allocator<int>_>::cbegin(&this->R);
    cVar11 = std::vector<int,_std::allocator<int>_>::cend(&this->R);
    solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
    ::
    push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              ((solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
                *)pbVar2,(bit_array *)prVar1,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               cVar10._M_current,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               cVar11._M_current,theta_local,objective_amplifier_local,fStack_3c,(float)remaining);
    this_local._4_4_ =
         compute_violated_constraints<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array>
                   ((solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                     *)x_local,(bit_array *)rng_local,&this->R);
    break;
  case reversing:
    std::vector<int,_std::allocator<int>_>::crbegin
              ((vector<int,_std::allocator<int>_> *)(local_58 + 8));
    std::vector<int,_std::allocator<int>_>::crend((vector<int,_std::allocator<int>_> *)local_58);
    solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
    ::
    push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
              ((solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
                *)pbVar2,(bit_array *)prVar1,
               (reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                *)(local_58 + 8),
               (reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                *)local_58,theta_local,objective_amplifier_local,fStack_3c,(float)remaining);
    this_local._4_4_ =
         compute_violated_constraints<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array>
                   ((solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                     *)x_local,(bit_array *)rng_local,&this->R);
    break;
  case random_sorting:
    iVar8 = std::vector<int,_std::allocator<int>_>::begin(&this->R);
    iVar9 = std::vector<int,_std::allocator<int>_>::end(&this->R);
    std::
    shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar8._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar9._M_current,
               _delta_local);
    pbVar2 = x_local;
    prVar1 = rng_local;
    iVar8 = std::vector<int,_std::allocator<int>_>::begin(&this->R);
    iVar9 = std::vector<int,_std::allocator<int>_>::end(&this->R);
    solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
    ::
    push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
                *)pbVar2,(bit_array *)prVar1,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar8._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar9._M_current,
               theta_local,objective_amplifier_local,fStack_3c,(float)remaining);
    this_local._4_4_ =
         compute_violated_constraints<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array>
                   ((solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                     *)x_local,(bit_array *)rng_local,&this->R);
    break;
  case infeasibility_decr:
    iVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                      (&this->m_order);
    iVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                      (&this->m_order);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,baryonyx::itm::compute_order::push_and_run<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array,float>(baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,float,float,float,float)::_lambda(auto:1_const&,auto:2_const&)_1_>
              (iVar4._M_current,iVar5._M_current);
    pbVar2 = x_local;
    prVar1 = rng_local;
    cVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::cbegin
                      (&this->m_order);
    cVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::cend
                      (&this->m_order);
    solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
    ::
    push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              ((solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
                *)pbVar2,(bit_array *)prVar1,
               (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )cVar6._M_current,
               (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )cVar7._M_current,theta_local,objective_amplifier_local,fStack_3c,(float)remaining);
    this_local._4_4_ =
         infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array>
                   (this,(solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                          *)x_local,(bit_array *)rng_local);
    break;
  case infeasibility_incr:
    iVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                      (&this->m_order);
    iVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                      (&this->m_order);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,baryonyx::itm::compute_order::push_and_run<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array,float>(baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,float,float,float,float)::_lambda(auto:1_const&,auto:2_const&)_2_>
              (iVar4._M_current,iVar5._M_current);
    pbVar2 = x_local;
    prVar1 = rng_local;
    cVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::cbegin
                      (&this->m_order);
    cVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::cend
                      (&this->m_order);
    solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
    ::
    push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              ((solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
                *)pbVar2,(bit_array *)prVar1,
               (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )cVar6._M_current,
               (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )cVar7._M_current,theta_local,objective_amplifier_local,fStack_3c,(float)remaining);
    this_local._4_4_ =
         infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array>
                   (this,(solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                          *)x_local,(bit_array *)rng_local);
    break;
  case lagrangian_decr:
    iVar8 = std::vector<int,_std::allocator<int>_>::begin(&this->R);
    iVar9 = std::vector<int,_std::allocator<int>_>::end(&this->R);
    std::
    sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,baryonyx::itm::compute_order::push_and_run<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array,float>(baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,float,float,float,float)::_lambda(auto:1,auto:2)_1_>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar8._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar9._M_current,
               (anon_class_8_1_6bb05151)x_local);
    pbVar2 = x_local;
    prVar1 = rng_local;
    cVar10 = std::vector<int,_std::allocator<int>_>::cbegin(&this->R);
    cVar11 = std::vector<int,_std::allocator<int>_>::cend(&this->R);
    solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
    ::
    push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              ((solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
                *)pbVar2,(bit_array *)prVar1,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               cVar10._M_current,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               cVar11._M_current,theta_local,objective_amplifier_local,fStack_3c,(float)remaining);
    this_local._4_4_ =
         compute_violated_constraints<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array>
                   ((solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                     *)x_local,(bit_array *)rng_local,&this->R);
    break;
  case lagrangian_incr:
    iVar8 = std::vector<int,_std::allocator<int>_>::begin(&this->R);
    iVar9 = std::vector<int,_std::allocator<int>_>::end(&this->R);
    std::
    sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,baryonyx::itm::compute_order::push_and_run<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array,float>(baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,float,float,float,float)::_lambda(auto:1,auto:2)_2_>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar8._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar9._M_current,
               (anon_class_8_1_6bb05151)x_local);
    pbVar2 = x_local;
    prVar1 = rng_local;
    cVar10 = std::vector<int,_std::allocator<int>_>::cbegin(&this->R);
    cVar11 = std::vector<int,_std::allocator<int>_>::cend(&this->R);
    solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
    ::
    push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              ((solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
                *)pbVar2,(bit_array *)prVar1,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               cVar10._M_current,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               cVar11._M_current,theta_local,objective_amplifier_local,fStack_3c,(float)remaining);
    this_local._4_4_ =
         compute_violated_constraints<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array>
                   ((solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                     *)x_local,(bit_array *)rng_local,&this->R);
    break;
  case pi_sign_change:
    iVar8 = std::vector<int,_std::allocator<int>_>::begin(&this->R);
    iVar9 = std::vector<int,_std::allocator<int>_>::end(&this->R);
    std::
    shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar8._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar9._M_current,
               _delta_local);
    pbVar2 = x_local;
    prVar1 = rng_local;
    iVar8 = std::vector<int,_std::allocator<int>_>::begin(&this->R);
    iVar9 = std::vector<int,_std::allocator<int>_>::end(&this->R);
    local_41 = solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
               ::
               push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                         ((solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
                           *)pbVar2,(bit_array *)prVar1,
                          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                          iVar8._M_current,
                          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                          iVar9._M_current,theta_local,objective_amplifier_local,fStack_3c,
                          (float)remaining);
    this_local._4_4_ =
         local_compute_violated_constraints<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array>
                   (this,(solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                          *)x_local,(bit_array *)rng_local);
    if (((local_41 & 1) == 0) && (this_local._4_4_ == 0)) {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int push_and_run(Solver& solver,
                     Xtype& x,
                     random_engine& rng,
                     Float kappa,
                     Float delta,
                     Float theta,
                     Float objective_amplifier)
    {
        bool pi_changed = 0;
        int remaining = 0;

        if (use_cycle)
            order = next_state(order);

        switch (order) {
        case solver_parameters::constraint_order::reversing:
            solver.push_and_compute_update_row(x,
                                               R.crbegin(),
                                               R.crend(),
                                               kappa,
                                               delta,
                                               theta,
                                               objective_amplifier);

            return compute_violated_constraints(solver, x, R);
        case solver_parameters::constraint_order::random_sorting:
            std::shuffle(R.begin(), R.end(), rng);

            solver.push_and_compute_update_row(
              x, R.begin(), R.end(), kappa, delta, theta, objective_amplifier);

            return compute_violated_constraints(solver, x, R);
        case solver_parameters::constraint_order::infeasibility_decr:
            std::sort(m_order.begin(),
                      m_order.end(),
                      [](const auto& lhs, const auto& rhs) {
                          return rhs.second < lhs.second;
                      });

            solver.push_and_compute_update_row(x,
                                               m_order.cbegin(),
                                               m_order.cend(),
                                               kappa,
                                               delta,
                                               theta,
                                               objective_amplifier);

            return infeasibility_local_compute_violated_constraints(solver, x);
        case solver_parameters::constraint_order::infeasibility_incr:
            std::sort(m_order.begin(),
                      m_order.end(),
                      [](const auto& lhs, const auto& rhs) {
                          return lhs.second < rhs.second;
                      });
            solver.push_and_compute_update_row(x,
                                               m_order.cbegin(),
                                               m_order.cend(),
                                               kappa,
                                               delta,
                                               theta,
                                               objective_amplifier);

            return infeasibility_local_compute_violated_constraints(solver, x);
        case solver_parameters::constraint_order::lagrangian_decr:
            std::sort(
              R.begin(), R.end(), [&solver](const auto lhs, const auto rhs) {
                  return solver.pi[rhs] < solver.pi[lhs];
              });

            solver.push_and_compute_update_row(x,
                                               R.cbegin(),
                                               R.cend(),
                                               kappa,
                                               delta,
                                               theta,
                                               objective_amplifier);

            return compute_violated_constraints(solver, x, R);
        case solver_parameters::constraint_order::lagrangian_incr:
            std::sort(
              R.begin(), R.end(), [&solver](const auto lhs, const auto rhs) {
                  return solver.pi[lhs] < solver.pi[rhs];
              });

            solver.push_and_compute_update_row(x,
                                               R.cbegin(),
                                               R.cend(),
                                               kappa,
                                               delta,
                                               theta,
                                               objective_amplifier);

            return compute_violated_constraints(solver, x, R);
        case solver_parameters::constraint_order::pi_sign_change:
            std::shuffle(R.begin(), R.end(), rng);

            pi_changed = solver.push_and_compute_update_row(
              x, R.begin(), R.end(), kappa, delta, theta, objective_amplifier);
            remaining = local_compute_violated_constraints(solver, x);

            if (!pi_changed && remaining == 0)
                return 0;

            return remaining;
        case solver_parameters::constraint_order::none:
        default:
            solver.push_and_compute_update_row(x,
                                               R.cbegin(),
                                               R.cend(),
                                               kappa,
                                               delta,
                                               theta,
                                               objective_amplifier);
            return compute_violated_constraints(solver, x, R);
        }
    }